

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median.h
# Opt level: O3

uchar pseudo_median<unsigned_char>(uchar *begin,uchar *end)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar7 = (long)end - (long)begin;
  if (uVar7 < 4) {
    __assert_fail("N>3",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/median.h"
                  ,0x41,"CharT pseudo_median(CharT *, CharT *) [CharT = unsigned char]");
  }
  bVar4 = *begin;
  bVar1 = begin[1];
  bVar5 = bVar4;
  if ((bVar4 != bVar1) && (bVar3 = begin[2], bVar5 = bVar3, bVar3 != bVar1 && bVar3 != bVar4)) {
    bVar5 = bVar1;
    if (bVar4 < bVar1) {
      if ((bVar3 <= bVar1) && (bVar5 = bVar3, bVar3 < bVar4)) {
        bVar5 = bVar4;
      }
    }
    else if ((bVar1 <= bVar3) && (bVar5 = bVar3, bVar4 < bVar3)) {
      bVar5 = bVar4;
    }
  }
  uVar8 = uVar7 >> 1;
  bVar4 = begin[uVar8];
  bVar1 = begin[uVar8 + 1];
  bVar3 = bVar4;
  if ((bVar4 != bVar1) &&
     (bVar6 = begin[uVar8 + 2], bVar3 = bVar6, bVar6 != bVar1 && bVar6 != bVar4)) {
    bVar3 = bVar1;
    if (bVar4 < bVar1) {
      if ((bVar6 <= bVar1) && (bVar3 = bVar6, bVar6 < bVar4)) {
        bVar3 = bVar4;
      }
    }
    else if ((bVar1 <= bVar6) && (bVar3 = bVar6, bVar4 < bVar6)) {
      bVar3 = bVar4;
    }
  }
  bVar4 = begin[uVar7 - 3];
  bVar1 = begin[uVar7 - 2];
  bVar6 = bVar4;
  if ((bVar4 != bVar1) &&
     (bVar2 = begin[uVar7 - 1], bVar6 = bVar2, bVar2 != bVar1 && bVar2 != bVar4)) {
    bVar6 = bVar1;
    if (bVar4 < bVar1) {
      if ((bVar2 <= bVar1) && (bVar6 = bVar2, bVar2 < bVar4)) {
        bVar6 = bVar4;
      }
    }
    else if ((bVar1 <= bVar2) && (bVar6 = bVar2, bVar4 < bVar2)) {
      bVar6 = bVar4;
    }
  }
  bVar4 = bVar5;
  if (bVar5 != bVar3) {
    if ((bVar6 == bVar5) || (bVar6 == bVar3)) {
      return bVar6;
    }
    bVar4 = bVar3;
    if (bVar5 < bVar3) {
      if (bVar6 <= bVar3) {
        if (bVar6 < bVar5) {
          bVar6 = bVar5;
        }
        return bVar6;
      }
    }
    else if (bVar3 <= bVar6) {
      if (bVar5 < bVar6) {
        bVar6 = bVar5;
      }
      return bVar6;
    }
  }
  return bVar4;
}

Assistant:

inline CharT
pseudo_median(CharT* begin, CharT* end)
{
	size_t N=end-begin;
	assert(N>3);
	return med3char(
			med3char(begin[0],   begin[1],     begin[2]),
			med3char(begin[N/2], begin[N/2+1], begin[N/2+2]),
			med3char(begin[N-3], begin[N-2],   begin[N-1])
		       );
}